

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void iterateArray(Array a,_func_void_Data_void_ptr_void_ptr *foreach,void *arg1,void *arg2)

{
  VM vm;
  element *el;
  void *arg2_local;
  void *arg1_local;
  _func_void_Data_void_ptr_void_ptr *foreach_local;
  Array a_local;
  
  vm = (VM)a->head;
  while ((vm != (VM)0x0 && (*(int *)((long)arg1 + 0x28) == 0))) {
    (*foreach)((Data)vm->stack,arg1,arg2);
    vm = *(VM *)&vm->lexer;
  }
  return;
}

Assistant:

void iterateArray(Array a, void (*foreach)(Data, void *, void *),
                  void *arg1, void *arg2) {
    struct element *el = a->head;
    VM vm = arg1;
    while (el) {
        if (vm->error_code)return;
        foreach(el->data, arg1, arg2);
        el = el->next;
    }
}